

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vlvg(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 src;
  byte es_00;
  MemOp_conflict MVar1;
  int iVar2;
  int reg;
  TCGv_ptr ptr_00;
  uint8_t enr;
  TCGv_ptr ptr;
  uint8_t es;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  MVar1 = get_field1(s,FLD_O_m4,FLD_C_b4);
  es_00 = (byte)MVar1;
  if (es_00 < 4) {
    iVar2 = get_field1(s,FLD_O_b2,FLD_C_b2);
    if (iVar2 == 0) {
      iVar2 = get_field1(s,FLD_O_d2,FLD_C_d2);
      src = o->in2;
      reg = get_field1(s,FLD_O_v1,FLD_C_b1);
      write_vec_element_i64
                (tcg_ctx_00,src,reg,(byte)iVar2 & (char)(0x10 / (long)(1 << (es_00 & 0x1f))) - 1U,
                 MVar1 & 0xff);
      s_local._4_4_ = DISAS_NEXT;
    }
    else {
      ptr_00 = tcg_temp_new_ptr(tcg_ctx_00);
      iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
      get_vec_element_ptr_i64(tcg_ctx_00,ptr_00,(uint8_t)iVar2,o->addr1,es_00);
      switch(es_00) {
      case 0:
        tcg_gen_st8_i64(tcg_ctx_00,o->in2,ptr_00,0);
        break;
      case 1:
        tcg_gen_st16_i64(tcg_ctx_00,o->in2,ptr_00,0);
        break;
      case 2:
        tcg_gen_st32_i64(tcg_ctx_00,o->in2,ptr_00,0);
        break;
      case 3:
        tcg_gen_st_i64_s390x(tcg_ctx_00,o->in2,ptr_00,0);
      }
      tcg_temp_free_ptr(tcg_ctx_00,ptr_00);
      s_local._4_4_ = DISAS_NEXT;
    }
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vlvg(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m4);
    TCGv_ptr ptr;

    if (es > ES_64) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    /* fast path if we don't need the register content */
    if (!get_field(s, b2)) {
        uint8_t enr = get_field(s, d2) & (NUM_VEC_ELEMENTS(es) - 1);

        write_vec_element_i64(tcg_ctx, o->in2, get_field(s, v1), enr, es);
        return DISAS_NEXT;
    }

    ptr = tcg_temp_new_ptr(tcg_ctx);
    get_vec_element_ptr_i64(tcg_ctx, ptr, get_field(s, v1), o->addr1, es);
    switch (es) {
    case ES_8:
        tcg_gen_st8_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_16:
        tcg_gen_st16_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_32:
        tcg_gen_st32_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_64:
        tcg_gen_st_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    default:
        // g_assert_not_reached();
        break;
    }
    tcg_temp_free_ptr(tcg_ctx, ptr);

    return DISAS_NEXT;
}